

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintDocumentation(cmDocumentation *this,Type ht,ostream *os)

{
  bool bVar1;
  
  switch(ht) {
  case Version:
    PrintVersion(this,os);
    break;
  case Usage:
    PrintUsage(this,os);
    break;
  case Help:
    PrintHelp(this,os);
    break;
  case Full:
    bVar1 = PrintHelpFull(this,os);
    return bVar1;
  case ListManuals:
    PrintHelpListManuals(this,os);
    break;
  case ListCommands:
    PrintHelpListCommands(this,os);
    break;
  case ListModules:
    PrintHelpListModules(this,os);
    break;
  case ListProperties:
    PrintHelpListProperties(this,os);
    break;
  case ListVariables:
    PrintHelpListVariables(this,os);
    break;
  case ListPolicies:
    PrintHelpListPolicies(this,os);
    break;
  case ListGenerators:
    PrintHelpListGenerators(this,os);
    break;
  case OneManual:
    bVar1 = PrintHelpOneManual(this,os);
    return bVar1;
  case OneCommand:
    bVar1 = PrintHelpOneCommand(this,os);
    return bVar1;
  case OneModule:
    bVar1 = PrintHelpOneModule(this,os);
    return bVar1;
  case OneProperty:
    bVar1 = PrintHelpOneProperty(this,os);
    return bVar1;
  case OneVariable:
    bVar1 = PrintHelpOneVariable(this,os);
    return bVar1;
  case OnePolicy:
    bVar1 = PrintHelpOnePolicy(this,os);
    return bVar1;
  case OldCustomModules:
    PrintOldCustomModules(this,os);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool cmDocumentation::PrintDocumentation(Type ht, std::ostream& os)
{
  switch (ht)
    {
    case cmDocumentation::Usage:
      return this->PrintUsage(os);
    case cmDocumentation::Help:
      return this->PrintHelp(os);
    case cmDocumentation::Full:
      return this->PrintHelpFull(os);
    case cmDocumentation::OneManual:
      return this->PrintHelpOneManual(os);
    case cmDocumentation::OneCommand:
      return this->PrintHelpOneCommand(os);
    case cmDocumentation::OneModule:
      return this->PrintHelpOneModule(os);
    case cmDocumentation::OnePolicy:
      return this->PrintHelpOnePolicy(os);
    case cmDocumentation::OneProperty:
      return this->PrintHelpOneProperty(os);
    case cmDocumentation::OneVariable:
      return this->PrintHelpOneVariable(os);
    case cmDocumentation::ListManuals:
      return this->PrintHelpListManuals(os);
    case cmDocumentation::ListCommands:
      return this->PrintHelpListCommands(os);
    case cmDocumentation::ListModules:
      return this->PrintHelpListModules(os);
    case cmDocumentation::ListProperties:
      return this->PrintHelpListProperties(os);
    case cmDocumentation::ListVariables:
      return this->PrintHelpListVariables(os);
    case cmDocumentation::ListPolicies:
      return this->PrintHelpListPolicies(os);
    case cmDocumentation::ListGenerators:
      return this->PrintHelpListGenerators(os);
    case cmDocumentation::Version:
      return this->PrintVersion(os);
    case cmDocumentation::OldCustomModules:
      return this->PrintOldCustomModules(os);
    default: return false;
    }
}